

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

string * __thiscall Node::OutputInteger_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  ulong uVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar5 = 0;
  bVar3 = false;
LAB_00114ecf:
  bVar2 = bVar3;
  do {
    cVar4 = (char)__return_storage_ptr__;
    if ((this->TextValue)._M_string_length <= uVar5) {
      if (!bVar2) {
        std::__cxx11::string::push_back(cVar4);
      }
      return __return_storage_ptr__;
    }
    cVar1 = (this->TextValue)._M_dataplus._M_p[uVar5];
    uVar5 = uVar5 + 1;
  } while (cVar1 == '%');
  if (cVar1 == '0') goto code_r0x00114ef0;
  if (!bVar2 && cVar1 == '.') {
    std::__cxx11::string::push_back(cVar4);
  }
  goto LAB_00114f18;
code_r0x00114ef0:
  bVar3 = false;
  if (bVar2) {
LAB_00114f18:
    std::__cxx11::string::push_back(cVar4);
    bVar3 = true;
  }
  goto LAB_00114ecf;
}

Assistant:

std::string Node::OutputInteger(void)
{
	int OFlag = 0;		// Have we output something yet?
	int Ptr = 0;		// What character are we looking at
	char ch;		// Actual character
	std::string result;		// Working string

	//
	// Output all digits in the string
	//
	while ((ch = TextValue[Ptr]), (Ptr < TextValue.length()))
	{
		Ptr++;
		if (ch == '0')
		{
			if (OFlag != 0)
			{
				result += ch;
			}
		}
		else
		{
			if (ch != '%')
			{
				if ((ch == '.') && (OFlag == 0))
				{
					result += '0';
				}
				result += ch;
				OFlag = 1;
			}
		}
	}

	//
	// If we didn't output anything, then output a zero
	// because it must have been all zeros.
	//
	if (OFlag == 0)
	{
		result += '0';
	}

	return result;
}